

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  int iVar4;
  MessageLite *pMVar5;
  MapFieldBase *this_00;
  Type *pTVar6;
  Descriptor *pDVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  if (factory == (MessageFactory *)0x0) {
    factory = this->message_factory_;
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar5 = ExtensionSet::AddMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),field
                        ,factory);
    return (Message *)pMVar5;
  }
  bVar1 = FieldDescriptor::is_map(field);
  uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  if (bVar1) {
    this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
  }
  pTVar6 = RepeatedPtrFieldBase::
           AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     ((RepeatedPtrFieldBase *)this_00);
  if (pTVar6 == (Type *)0x0) {
    if (*(int *)&this_00->arena_ == 0) {
      pDVar7 = FieldDescriptor::message_type(field);
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,pDVar7);
      pTVar6 = (Type *)CONCAT44(extraout_var,iVar4);
    }
    else {
      pTVar6 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                         ((RepeatedPtrFieldBase *)this_00,0);
    }
    iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    iVar4 = (*(pTVar6->super_MessageLite)._vptr_MessageLite[4])
                      (pTVar6,CONCAT44(extraout_var_00,iVar4));
    pTVar6 = (Type *)CONCAT44(extraout_var_01,iVar4);
    RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              ((RepeatedPtrFieldBase *)this_00,pTVar6);
  }
  return pTVar6;
}

Assistant:

Message* GeneratedMessageReflection::AddMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = NULL;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = NULL;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == NULL) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}